

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rebalancing.hpp
# Opt level: O0

void __thiscall
Kernel::Rebalancing::BalanceIter<Kernel::Rebalancing::Inverters::NumberTheoryInverter>::BalanceIter
          (BalanceIter<Kernel::Rebalancing::Inverters::NumberTheoryInverter> *this,
          Balancer<Kernel::Rebalancing::Inverters::NumberTheoryInverter> *balancer,bool end)

{
  undefined4 uVar1;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  size_t in_stack_ffffffffffffffd8;
  BalanceIter<Kernel::Rebalancing::Inverters::NumberTheoryInverter> *in_stack_ffffffffffffffe0;
  
  Lib::Stack<Kernel::Rebalancing::Node>::Stack
            (&in_stack_ffffffffffffffe0->_path,in_stack_ffffffffffffffd8);
  uVar1 = 0;
  if ((in_DL & 1) != 0) {
    uVar1 = 2;
  }
  *(undefined4 *)(in_RDI + 0x20) = uVar1;
  *(undefined8 *)(in_RDI + 0x28) = in_RSI;
  if ((in_DL & 1) == 0) {
    findNextVar(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

BalanceIter<C>::BalanceIter(const Balancer<C>& balancer, bool end) 
  : _path(Stack<Node>())
  , _litIndex(end ? 2 : 0)
  , _balancer(balancer)
{
  if (end) {
    DEBUG("end")
  } else {
    DEBUG("begin(", balancer._lit.toString(), ")");
    ASS(balancer._lit.isEquality())
    findNextVar();
  }
}